

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::FboTestUtil::Texture2DShader::setUniforms
          (Texture2DShader *this,Context *gl,deUint32 program)

{
  undefined4 uVar1;
  uint uVar2;
  size_type sVar3;
  undefined8 uVar4;
  const_reference pvVar5;
  float *pfVar6;
  string local_168;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  string biasName;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string scaleName;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string samplerName;
  int texNdx;
  deUint32 program_local;
  Context *gl_local;
  Texture2DShader *this_local;
  
  samplerName.field_2._12_4_ = program;
  (*gl->_vptr_Context[0x76])(gl,(ulong)program);
  samplerName.field_2._8_4_ = 0;
  while( true ) {
    uVar1 = samplerName.field_2._8_4_;
    sVar3 = std::
            vector<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
            ::size(&this->m_inputs);
    if ((int)sVar3 <= (int)uVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"u_sampler",&local_61);
    de::toString<int>((string *)((long)&scaleName.field_2 + 8),
                      (int *)(samplerName.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&scaleName.field_2 + 8));
    std::__cxx11::string::~string((string *)(scaleName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"u_texScale",&local_d9);
    de::toString<int>((string *)((long)&biasName.field_2 + 8),
                      (int *)(samplerName.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   &local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&biasName.field_2 + 8));
    std::__cxx11::string::~string((string *)(biasName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"u_texBias",&local_141);
    de::toString<int>(&local_168,(int *)(samplerName.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                   &local_140,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    uVar1 = samplerName.field_2._12_4_;
    uVar4 = std::__cxx11::string::c_str();
    uVar2 = (*gl->_vptr_Context[0x66])(gl,(ulong)(uint)uVar1,uVar4);
    pvVar5 = std::
             vector<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
             ::operator[](&this->m_inputs,(long)(int)samplerName.field_2._8_4_);
    (*gl->_vptr_Context[0x5b])(gl,(ulong)uVar2,(ulong)(uint)pvVar5->unitNdx);
    uVar1 = samplerName.field_2._12_4_;
    uVar4 = std::__cxx11::string::c_str();
    uVar2 = (*gl->_vptr_Context[0x66])(gl,(ulong)(uint)uVar1,uVar4);
    pvVar5 = std::
             vector<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
             ::operator[](&this->m_inputs,(long)(int)samplerName.field_2._8_4_);
    pfVar6 = tcu::Vector<float,_4>::getPtr(&pvVar5->scale);
    (*gl->_vptr_Context[0x5f])(gl,(ulong)uVar2,1,pfVar6);
    uVar1 = samplerName.field_2._12_4_;
    uVar4 = std::__cxx11::string::c_str();
    uVar2 = (*gl->_vptr_Context[0x66])(gl,(ulong)(uint)uVar1,uVar4);
    pvVar5 = std::
             vector<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
             ::operator[](&this->m_inputs,(long)(int)samplerName.field_2._8_4_);
    pfVar6 = tcu::Vector<float,_4>::getPtr(&pvVar5->bias);
    (*gl->_vptr_Context[0x5f])(gl,(ulong)uVar2,1,pfVar6);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)local_40);
    samplerName.field_2._8_4_ = samplerName.field_2._8_4_ + 1;
  }
  uVar2 = (*gl->_vptr_Context[0x66])(gl,(ulong)(uint)samplerName.field_2._12_4_,"u_outScale0");
  pfVar6 = tcu::Vector<float,_4>::getPtr(&this->m_outScale);
  (*gl->_vptr_Context[0x5f])(gl,(ulong)uVar2,1,pfVar6);
  uVar2 = (*gl->_vptr_Context[0x66])(gl,(ulong)(uint)samplerName.field_2._12_4_,"u_outBias0");
  pfVar6 = tcu::Vector<float,_4>::getPtr(&this->m_outBias);
  (*gl->_vptr_Context[0x5f])(gl,(ulong)uVar2,1,pfVar6);
  return;
}

Assistant:

void Texture2DShader::setUniforms (sglr::Context& gl, deUint32 program) const
{
	gl.useProgram(program);

	for (int texNdx = 0; texNdx < (int)m_inputs.size(); texNdx++)
	{
		string	samplerName	= string("u_sampler") + de::toString(texNdx);
		string	scaleName	= string("u_texScale") + de::toString(texNdx);
		string	biasName	= string("u_texBias") + de::toString(texNdx);

		gl.uniform1i(gl.getUniformLocation(program, samplerName.c_str()), m_inputs[texNdx].unitNdx);
		gl.uniform4fv(gl.getUniformLocation(program, scaleName.c_str()), 1, m_inputs[texNdx].scale.getPtr());
		gl.uniform4fv(gl.getUniformLocation(program, biasName.c_str()), 1, m_inputs[texNdx].bias.getPtr());
	}

	gl.uniform4fv(gl.getUniformLocation(program, "u_outScale0"), 1, m_outScale.getPtr());
	gl.uniform4fv(gl.getUniformLocation(program, "u_outBias0"), 1, m_outBias.getPtr());
}